

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

void __thiscall RenX::Server::Server(Server *this,string_view configurationSection)

{
  pointer ppPVar1;
  rep rVar2;
  undefined8 uVar3;
  EVP_PKEY_CTX *ctx;
  Core *this_00;
  vector<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_> *pvVar4;
  Plugin **plugin;
  pointer ppPVar5;
  
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR___cxa_pure_virtual_0015cad0;
  Jupiter::Rehashable::Rehashable(&this->super_Rehashable);
  (this->super_Thinker)._vptr_Thinker = (_func_int **)&PTR_think_0015c8a0;
  *(undefined ***)&this->super_Rehashable = &PTR_OnRehash_0015c8d8;
  (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->players;
  (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->players;
  (this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
  _M_node._M_size = 0;
  (this->buildings).
  super__Vector_base<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buildings).
  super__Vector_base<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buildings).
  super__Vector_base<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>,_std::allocator<std::unique_ptr<RenX::BuildingInfo,_std::default_delete<RenX::BuildingInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mutators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mutators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mutators).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(code **)&this->varData = operator_delete;
  *(undefined1 **)&this->field_0x78 = &this->field_0x88;
  *(undefined8 *)&this->field_0x80 = 0;
  this->field_0x88 = 0;
  *(undefined1 **)&this->field_0x98 = &this->field_0xc8;
  *(undefined8 *)&this->field_0xa0 = 1;
  *(undefined8 *)&this->field_0xa8 = 0;
  *(undefined8 *)&this->field_0xb0 = 0;
  *(undefined4 *)&this->field_0xb8 = 0x3f800000;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(undefined8 *)&this->field_0xc8 = 0;
  *(undefined8 *)&this->field_0xd0 = 0;
  this->m_gameover_when_empty = false;
  this->m_gameover_pending = false;
  this->m_pure = false;
  this->m_connected = false;
  this->m_subscribed = false;
  this->m_fully_connected = false;
  this->m_seamless = false;
  this->m_firstKill = false;
  this->m_seamless = false;
  this->m_firstKill = false;
  this->m_firstDeath = false;
  this->m_firstAction = false;
  this->m_awaitingPong = false;
  this->m_passworded = false;
  this->m_steamRequired = false;
  this->m_privateMessageTeamOnly = false;
  this->m_allowPrivateMessaging = true;
  this->m_spawnCrates = true;
  this->m_botsEnabled = true;
  this->m_competitive = false;
  this->m_devBot = false;
  this->m_reliable = false;
  this->m_ranked = false;
  this->m_team_mode = 3;
  this->m_match_state = 1;
  this->m_game_type = 1;
  this->m_attempts = 0;
  this->m_playerLimit = 0;
  this->m_vehicleLimit = 0;
  this->m_mineLimit = 0;
  *(undefined8 *)&this->m_timeLimit = 0;
  *(undefined8 *)((long)&this->m_bot_count + 4) = 0;
  *(undefined8 *)((long)&this->m_player_rdns_resolutions_pending + 4) = 0;
  *(undefined8 *)&this->m_gameVersionNumber = 0;
  *(undefined4 *)((long)&this->m_crateRespawnAfterPickup + 4) = 0;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastAttempt).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_gameStart).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastClientListUpdate).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastBuildingListUpdate).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastActivity).__d.__r = rVar2;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_lastSendActivity).__d.__r = rVar2;
  (this->m_gameover_time).__d.__r = 0;
  (this->m_lastLine)._M_dataplus._M_p = (pointer)&(this->m_lastLine).field_2;
  (this->m_lastLine)._M_string_length = 0;
  (this->m_lastLine).field_2._M_local_buf[0] = '\0';
  (this->m_rconUser)._M_dataplus._M_p = (pointer)&(this->m_rconUser).field_2;
  (this->m_rconUser)._M_string_length = 0;
  (this->m_rconUser).field_2._M_local_buf[0] = '\0';
  (this->m_gameVersion)._M_dataplus._M_p = (pointer)&(this->m_gameVersion).field_2;
  (this->m_gameVersion)._M_string_length = 0;
  (this->m_gameVersion).field_2._M_local_buf[0] = '\0';
  (this->m_serverName)._M_dataplus._M_p = (pointer)&(this->m_serverName).field_2;
  (this->m_serverName)._M_string_length = 0;
  (this->m_serverName).field_2._M_local_buf[0] = '\0';
  (this->m_lastCommand)._M_dataplus._M_p = (pointer)&(this->m_lastCommand).field_2;
  (this->m_lastCommand)._M_string_length = 0;
  (this->m_lastCommand).field_2._M_local_buf[0] = '\0';
  (this->m_lastCommandParams)._M_dataplus._M_p = (pointer)&(this->m_lastCommandParams).field_2;
  (this->m_lastCommandParams)._M_string_length = 0;
  (this->m_lastCommandParams).field_2._M_local_buf[0] = '\0';
  Map::Map(&this->m_map);
  Jupiter::TCPSocket::TCPSocket(&this->m_sock);
  (this->m_commands).
  super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_commands).
  super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_commandListFormat).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_commands).
  super__Vector_base<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>,_std::allocator<std::unique_ptr<RenX::GameCommand,_std::default_delete<RenX::GameCommand>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_commandListFormat).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_commandListFormat).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_clientHostname)._M_dataplus._M_p = (pointer)&(this->m_clientHostname).field_2;
  (this->m_clientHostname)._M_string_length = 0;
  (this->m_clientHostname).field_2._M_local_buf[0] = '\0';
  (this->m_hostname)._M_dataplus._M_p = (pointer)&(this->m_hostname).field_2;
  (this->m_hostname)._M_string_length = 0;
  (this->m_hostname).field_2._M_local_buf[0] = '\0';
  (this->m_pass)._M_dataplus._M_p = (pointer)&(this->m_pass).field_2;
  (this->m_pass)._M_string_length = 0;
  (this->m_pass).field_2._M_local_buf[0] = '\0';
  (this->m_configSection)._M_dataplus._M_p = (pointer)&(this->m_configSection).field_2;
  (this->m_configSection)._M_string_length = 0;
  (this->m_configSection).field_2._M_local_buf[0] = '\0';
  (this->m_rules)._M_dataplus._M_p = (pointer)&(this->m_rules).field_2;
  (this->m_rules)._M_string_length = 0;
  (this->m_rules).field_2._M_local_buf[0] = '\0';
  (this->m_ban_from_str)._M_dataplus._M_p = (pointer)&(this->m_ban_from_str).field_2;
  (this->m_ban_from_str)._M_string_length = 0;
  (this->m_ban_from_str).field_2._M_local_buf[0] = '\0';
  (this->m_IRCPrefix)._M_dataplus._M_p = (pointer)&(this->m_IRCPrefix).field_2;
  (this->m_IRCPrefix)._M_string_length = 0;
  (this->m_IRCPrefix).field_2._M_local_buf[0] = '\0';
  (this->m_CommandPrefix)._M_dataplus._M_p = (pointer)&(this->m_CommandPrefix).field_2;
  (this->m_CommandPrefix)._M_string_length = 0;
  (this->m_CommandPrefix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_configSection,0,0,configurationSection._M_str,configurationSection._M_len);
  this->m_calc_uuid = default_uuid_func_abi_cxx11_;
  getCore();
  uVar3 = Jupiter::Plugin::getConfig();
  ctx = (EVP_PKEY_CTX *)
        Jupiter::Config::getSection
                  (uVar3,(this->m_configSection)._M_string_length,
                   (this->m_configSection)._M_dataplus._M_p);
  init(this,ctx);
  this_00 = getCore();
  pvVar4 = Core::getPlugins(this_00);
  ppPVar1 = (pvVar4->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar5 = (pvVar4->super__Vector_base<RenX::Plugin_*,_std::allocator<RenX::Plugin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppPVar5 != ppPVar1; ppPVar5 = ppPVar5 + 1
      ) {
    (**(code **)(*(long *)*ppPVar5 + 0x118))(*ppPVar5,this);
  }
  return;
}

Assistant:

RenX::Server::Server(std::string_view configurationSection) {
	m_configSection = configurationSection;
	m_calc_uuid = RenX::default_uuid_func;
	init(*RenX::getCore()->getConfig().getSection(m_configSection));
	for (const auto& plugin : RenX::getCore()->getPlugins()) {
		plugin->RenX_OnServerCreate(*this);
	}
}